

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O3

void __thiscall QList<QList<QString>_>::reserve(QList<QList<QString>_> *this,qsizetype asize)

{
  ArrayOptions *pAVar1;
  QList<QString> *pQVar2;
  uint uVar3;
  Data *pDVar4;
  Data *pDVar5;
  QList<QString> *data;
  QList<QString> *pQVar6;
  long lVar7;
  QList<QString> *pQVar8;
  long in_FS_OFFSET;
  QArrayData *d;
  QArrayDataPointer<QList<QString>_> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->d).d;
  if ((pDVar4 != (Data *)0x0) &&
     (asize <= ((long)((long)(this->d).ptr -
                      ((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0))
               >> 3) * 0x5555555555555555 + (pDVar4->super_QArrayData).alloc)) {
    uVar3 = (pDVar4->super_QArrayData).flags.super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
            super_QFlagsStorage<QArrayData::ArrayOption>.i;
    if ((uVar3 & 1) != 0) goto LAB_0063edf7;
    if ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 1) {
      (pDVar4->super_QArrayData).flags.super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
      super_QFlagsStorage<QArrayData::ArrayOption>.i = uVar3 | 1;
      goto LAB_0063edf7;
    }
  }
  lVar7 = (this->d).size;
  if (asize < lVar7) {
    asize = lVar7;
  }
  local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  pQVar6 = (QList<QString> *)QArrayData::allocate((QArrayData **)&local_38,0x18,0x10,asize,KeepSize)
  ;
  local_38.size = 0;
  lVar7 = (this->d).size;
  if (lVar7 < 1) {
    lVar7 = 0;
  }
  else {
    pQVar8 = (this->d).ptr;
    pQVar2 = pQVar8 + lVar7;
    do {
      pDVar5 = (pQVar8->d).d;
      pQVar6[local_38.size].d.d = pDVar5;
      pQVar6[local_38.size].d.ptr = (pQVar8->d).ptr;
      pQVar6[local_38.size].d.size = (pQVar8->d).size;
      if (pDVar5 != (Data *)0x0) {
        LOCK();
        (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pQVar8 = pQVar8 + 1;
      lVar7 = local_38.size + 1;
      local_38.size = lVar7;
    } while (pQVar8 < pQVar2);
  }
  if (local_38.d != (Data *)0x0) {
    pAVar1 = &((local_38.d)->super_QArrayData).flags;
    *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
              super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
               super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
  }
  pDVar4 = (this->d).d;
  local_38.ptr = (this->d).ptr;
  (this->d).d = local_38.d;
  (this->d).ptr = pQVar6;
  local_38.size = (this->d).size;
  (this->d).size = lVar7;
  local_38.d = pDVar4;
  QArrayDataPointer<QList<QString>_>::~QArrayDataPointer(&local_38);
LAB_0063edf7:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QList<T>::reserve(qsizetype asize)
{
    // capacity() == 0 for immutable data, so this will force a detaching below
    if (asize <= capacity() - d.freeSpaceAtBegin()) {
        if (d->flags() & Data::CapacityReserved)
            return;  // already reserved, don't shrink
        if (!d->isShared()) {
            // accept current allocation, don't shrink
            d->setFlag(Data::CapacityReserved);
            return;
        }
    }

    DataPointer detached(qMax(asize, size()));
    detached->copyAppend(d->begin(), d->end());
    if (detached.d_ptr())
        detached->setFlag(Data::CapacityReserved);
    d.swap(detached);
}